

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_int __thiscall
CLIntercept::CopyImageHelper
          (CLIntercept *this,cl_context context,cl_command_queue commandQueue,cl_mem srcImage,
          cl_mem dstImage,size_t *srcOrigin,size_t *dstOrigin,size_t *region,
          cl_uint numEventsInWaitList,cl_event *eventWaitList,cl_event *event)

{
  uint uVar1;
  mapped_type *ppSVar2;
  cl_icd_dispatch *pcVar3;
  cl_mem in_RCX;
  cl_command_queue in_RDX;
  CLIntercept *in_RDI;
  cl_mem in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  ulong *in_stack_00000010;
  cl_uint in_stack_00000018;
  cl_event *in_stack_00000020;
  cl_event *in_stack_00000028;
  size_t local_work_size [3];
  size_t global_work_size [3];
  cl_uint uiArg;
  cl_kernel kernel;
  cl_image_format dstFormat;
  cl_image_format srcFormat;
  cl_mem_object_type dstType;
  cl_mem_object_type srcType;
  SPrecompiledKernelOverrides *pOverrides;
  cl_int errorCode;
  bool local_ca;
  bool local_c9;
  key_type *in_stack_ffffffffffffff38;
  map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
  *in_stack_ffffffffffffff40;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  undefined4 local_88;
  int local_84 [7];
  cl_kernel local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  mapped_type local_48;
  uint local_3c;
  undefined8 *local_38;
  cl_mem local_30;
  cl_mem local_28;
  cl_command_queue local_20;
  
  local_3c = 0;
  local_48 = (mapped_type)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  ppSVar2 = std::
            map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
            ::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_48 = *ppSVar2;
  if (local_48 == (mapped_type)0x0) {
    local_3c = 0xffffffe2;
  }
  local_4c = 0x10f0;
  if (local_3c == 0) {
    pcVar3 = dispatch(in_RDI);
    local_3c = (*pcVar3->clGetMemObjectInfo)(local_28,0x1100,4,&local_4c,(size_t *)0x0);
  }
  local_50 = 0x10f0;
  if (local_3c == 0) {
    pcVar3 = dispatch(in_RDI);
    local_3c = (*pcVar3->clGetMemObjectInfo)(local_28,0x1100,4,&local_50,(size_t *)0x0);
  }
  memset(&local_58,0,8);
  if (local_3c == 0) {
    pcVar3 = dispatch(in_RDI);
    local_3c = (*pcVar3->clGetImageInfo)(local_28,0x1110,8,&local_58,(size_t *)0x0);
  }
  memset(&local_60,0,8);
  if (local_3c == 0) {
    pcVar3 = dispatch(in_RDI);
    local_3c = (*pcVar3->clGetImageInfo)(local_30,0x1110,8,&local_60,(size_t *)0x0);
  }
  if (local_3c == 0) {
    if ((local_54 != local_5c) || (local_58 != local_60)) {
      local_3c = 0xfffffff7;
    }
    if (local_4c == 0x10f1) {
      if ((local_38[2] != 0) || (in_stack_00000010[2] != 1)) {
        local_3c = 0xffffffe2;
      }
    }
    else if (local_4c != 0x10f2) {
      local_3c = 0xffffffc5;
    }
    if (local_50 == 0x10f1) {
      if ((in_stack_00000008[2] != 0) || (in_stack_00000010[2] != 1)) {
        local_3c = 0xffffffe2;
      }
    }
    else if (local_50 != 0x10f2) {
      local_3c = 0xffffffc5;
    }
  }
  local_68 = (cl_kernel)0x0;
  if (local_3c != 0) goto LAB_0021e141;
  if (3 < local_54 - 0x10d0U) {
    if (local_54 - 0x10d7U < 3) {
      if (local_4c == 0x10f1) {
        if (local_50 == 0x10f1) {
          local_68 = local_48->Kernel_CopyImage2Dto2DInt;
        }
        else {
          local_84[4] = 0;
          std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_84 + 4);
          local_3c = 0xffffffc5;
        }
      }
      else {
        local_84[3] = 0;
        std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_84 + 3);
        local_3c = 0xffffffc5;
      }
      goto LAB_0021e141;
    }
    if (local_54 - 0x10daU < 3) {
      if (local_4c == 0x10f1) {
        if (local_50 == 0x10f1) {
          local_68 = local_48->Kernel_CopyImage2Dto2DUInt;
        }
        else {
          local_84[2] = 0;
          std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_84 + 2);
          local_3c = 0xffffffc5;
        }
      }
      else {
        local_84[1] = 0;
        std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_84 + 1);
        local_3c = 0xffffffc5;
      }
      goto LAB_0021e141;
    }
    if (local_54 != 0x10dd && local_54 != 0x10de) {
      local_84[0] = 0;
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_84);
      local_3c = 0xffffffd9;
      goto LAB_0021e141;
    }
  }
  if (local_4c == 0x10f1) {
    if (local_50 == 0x10f1) {
      local_68 = local_48->Kernel_CopyImage2Dto2DFloat;
    }
    else {
      local_84[6] = 0;
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_84 + 6);
      local_3c = 0xffffffc5;
    }
  }
  else {
    local_84[5] = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_84 + 5);
    local_3c = 0xffffffc5;
  }
LAB_0021e141:
  if (local_3c == 0) {
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,0,8,&local_28);
    local_3c = uVar1 | local_3c;
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,1,8,&local_30);
    local_3c = uVar1 | local_3c;
    local_88 = (undefined4)*local_38;
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,2,4,&local_88);
    local_3c = uVar1 | local_3c;
    local_88 = (undefined4)local_38[1];
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,3,4,&local_88);
    local_3c = uVar1 | local_3c;
    local_88 = (undefined4)local_38[2];
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,4,4,&local_88);
    local_3c = uVar1 | local_3c;
    local_88 = (undefined4)*in_stack_00000008;
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,5,4,&local_88);
    local_3c = uVar1 | local_3c;
    local_88 = (undefined4)in_stack_00000008[1];
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,6,4,&local_88);
    local_3c = uVar1 | local_3c;
    local_88 = (undefined4)in_stack_00000008[2];
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,7,4,&local_88);
    local_3c = uVar1 | local_3c;
    local_88 = (undefined4)*in_stack_00000010;
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,8,4,&local_88);
    local_3c = uVar1 | local_3c;
    local_88 = (undefined4)in_stack_00000010[1];
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,9,4,&local_88);
    local_3c = uVar1 | local_3c;
    local_88 = (undefined4)in_stack_00000010[2];
    pcVar3 = dispatch(in_RDI);
    uVar1 = (*pcVar3->clSetKernelArg)(local_68,10,4,&local_88);
    local_3c = uVar1 | local_3c;
    if (local_3c == 0) {
      local_a8 = *in_stack_00000010;
      local_a0 = in_stack_00000010[1];
      local_98 = in_stack_00000010[2];
      if (local_a8 % 0x20 != 0) {
        local_a8 = (0x20 - local_a8 % 0x20) + local_a8;
      }
      local_c9 = true;
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_c9);
      local_ca = true;
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_ca);
      pcVar3 = dispatch(in_RDI);
      local_3c = (*pcVar3->clEnqueueNDRangeKernel)
                           (local_20,local_68,3,(size_t *)0x0,&local_a8,
                            (size_t *)&stack0xffffffffffffff38,in_stack_00000018,in_stack_00000020,
                            in_stack_00000028);
    }
  }
  return local_3c;
}

Assistant:

cl_int CLIntercept::CopyImageHelper(
    cl_context context,
    cl_command_queue commandQueue,
    cl_mem srcImage,
    cl_mem dstImage,
    const size_t* srcOrigin,
    const size_t* dstOrigin,
    const size_t* region,
    cl_uint numEventsInWaitList,
    const cl_event* eventWaitList,
    cl_event* event )
{
    // This function assumes that it is being called from within a critical
    // section, so it does not enter the critical section again.

    cl_int  errorCode = CL_SUCCESS;

    SPrecompiledKernelOverrides*    pOverrides = NULL;

    // Get the overrides for this context.
    if( errorCode == CL_SUCCESS )
    {
        pOverrides = m_PrecompiledKernelOverridesMap[ context ];
        if( pOverrides == NULL )
        {
            errorCode = CL_INVALID_VALUE;
        }
    }

    // Figure out the type of the source image.
    cl_mem_object_type  srcType = CL_MEM_OBJECT_BUFFER;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetMemObjectInfo(
            srcImage,
            CL_MEM_TYPE,
            sizeof( srcType ),
            &srcType,
            NULL );
    }

    // Figure out the type of the destination image.
    cl_mem_object_type  dstType = CL_MEM_OBJECT_BUFFER;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetMemObjectInfo(
            srcImage,
            CL_MEM_TYPE,
            sizeof( dstType ),
            &dstType,
            NULL );
    }

    // Figure out the format of the source image.
    cl_image_format srcFormat = { 0 };
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetImageInfo(
            srcImage,
            CL_IMAGE_FORMAT,
            sizeof( srcFormat ),
            &srcFormat,
            NULL );
    }

    // Figure out the format of the destination image.
    cl_image_format dstFormat = { 0 };
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetImageInfo(
            dstImage,
            CL_IMAGE_FORMAT,
            sizeof( dstFormat ),
            &dstFormat,
            NULL );
    }

    // Image formats must match.
    if( errorCode == CL_SUCCESS )
    {
        if( ( srcFormat.image_channel_data_type != dstFormat.image_channel_data_type ) ||
            ( srcFormat.image_channel_order != dstFormat.image_channel_order ) )
        {
            errorCode = CL_IMAGE_FORMAT_MISMATCH;
        }
        switch( srcType )
        {
        case CL_MEM_OBJECT_IMAGE2D:
            if( ( srcOrigin[2] != 0 ) ||
                ( region[2] != 1 ) )
            {
                errorCode = CL_INVALID_VALUE;
            }
            break;
        case CL_MEM_OBJECT_IMAGE3D:
            break;
        default:
            errorCode = CL_INVALID_OPERATION;
            break;
        }
        switch( dstType )
        {
        case CL_MEM_OBJECT_IMAGE2D:
            if( ( dstOrigin[2] != 0 ) ||
                ( region[2] != 1 ) )
            {
                errorCode = CL_INVALID_VALUE;
            }
            break;
        case CL_MEM_OBJECT_IMAGE3D:
            break;
        default:
            errorCode = CL_INVALID_OPERATION;
            break;
        }
    }

    cl_kernel   kernel = NULL;
    if( errorCode == CL_SUCCESS )
    {
        switch( srcFormat.image_channel_data_type )
        {
        case CL_UNORM_INT8:
        case CL_UNORM_INT16:
        case CL_SNORM_INT8:
        case CL_SNORM_INT16:
        case CL_HALF_FLOAT:
        case CL_FLOAT:
            // "Float" Images
            switch( srcType )
            {
            case CL_MEM_OBJECT_IMAGE2D:
                switch( dstType )
                {
                case CL_MEM_OBJECT_IMAGE2D:
                    // 2D to 2D
                    kernel = pOverrides->Kernel_CopyImage2Dto2DFloat;
                    break;
                default:
                    CLI_ASSERT( 0 );
                    errorCode = CL_INVALID_OPERATION;
                    break;
                }
                break;
            default:
                CLI_ASSERT( 0 );
                errorCode = CL_INVALID_OPERATION;
                break;
            }
            break;

        case CL_SIGNED_INT8:
        case CL_SIGNED_INT16:
        case CL_SIGNED_INT32:
            // "Int" Images
            switch( srcType )
            {
            case CL_MEM_OBJECT_IMAGE2D:
                switch( dstType )
                {
                case CL_MEM_OBJECT_IMAGE2D:
                    // 2D to 2D
                    kernel = pOverrides->Kernel_CopyImage2Dto2DInt;
                    break;
                default:
                    CLI_ASSERT( 0 );
                    errorCode = CL_INVALID_OPERATION;
                    break;
                }
                break;
            default:
                CLI_ASSERT( 0 );
                errorCode = CL_INVALID_OPERATION;
                break;
            }
            break;

        case CL_UNSIGNED_INT8:
        case CL_UNSIGNED_INT16:
        case CL_UNSIGNED_INT32:
            // "UInt" Images
            switch( srcType )
            {
            case CL_MEM_OBJECT_IMAGE2D:
                switch( dstType )
                {
                case CL_MEM_OBJECT_IMAGE2D:
                    // 2D to 2D
                    kernel = pOverrides->Kernel_CopyImage2Dto2DUInt;
                    break;
                default:
                    CLI_ASSERT( 0 );
                    errorCode = CL_INVALID_OPERATION;
                    break;
                }
                break;
            default:
                CLI_ASSERT( 0 );
                errorCode = CL_INVALID_OPERATION;
                break;
            }
            break;

        default:
            CLI_ASSERT( 0 );
            errorCode = CL_INVALID_IMAGE_FORMAT_DESCRIPTOR;
            break;
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            0,
            sizeof( srcImage ),
            &srcImage );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            1,
            sizeof( dstImage ),
            &dstImage );

        cl_uint uiArg = (cl_uint)( srcOrigin[0] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            2,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( srcOrigin[1] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            3,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( srcOrigin[2] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            4,
            sizeof( uiArg ),
            &uiArg );

        uiArg = (cl_uint)( dstOrigin[0] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            5,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( dstOrigin[1] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            6,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( dstOrigin[2] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            7,
            sizeof( uiArg ),
            &uiArg );

        uiArg = (cl_uint)( region[0] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            8,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( region[1] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            9,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( region[2] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            10,
            sizeof( uiArg ),
            &uiArg );

        if( errorCode == CL_SUCCESS )
        {
            size_t  global_work_size[3] =
            {
                region[0],
                region[1],
                region[2]
            };
            size_t  local_work_size[3] =
            {
                32,
                1,
                1
            };

            // Make sure global_work_size is an even multiple of local_work_size
            if( ( global_work_size[0] % local_work_size[0] ) != 0 )
            {
                global_work_size[0] +=
                    local_work_size[0] -
                    ( global_work_size[0] % local_work_size[0] );
            }
            CLI_ASSERT( local_work_size[1] == 1 );
            CLI_ASSERT( local_work_size[2] == 1 );

            // Execute kernel
            errorCode = dispatch().clEnqueueNDRangeKernel(
                commandQueue,
                kernel,
                3,
                NULL,
                global_work_size,
                local_work_size,
                numEventsInWaitList,
                eventWaitList,
                event );
        }
    }

    return errorCode;
}